

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

void duckdb::ConstantVector::SetNull(Vector *vector,bool is_null)

{
  LogicalType *type;
  PhysicalType PVar1;
  pointer puVar2;
  idx_t iVar3;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *pvVar4;
  pointer this;
  type vector_00;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *entry;
  pointer this_00;
  idx_t i;
  idx_t idx;
  
  while( true ) {
    TemplatedValidityMask<unsigned_long>::Set
              (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,0,
               (bool)((is_null ^ 1U) & 1));
    if (((is_null ^ 1U) & 1) != 0) {
      return;
    }
    PVar1 = (vector->type).physical_type_;
    if (PVar1 != ARRAY) break;
    type = &vector->type;
    vector = ArrayVector::GetEntryInternal<duckdb::Vector>(vector);
    iVar3 = ArrayType::GetSize(type);
    is_null = true;
    if (vector->vector_type != CONSTANT_VECTOR) {
      for (idx = 0; iVar3 != idx; idx = idx + 1) {
        FlatVector::SetNull(vector,idx,true);
      }
      return;
    }
  }
  if (PVar1 != STRUCT) {
    return;
  }
  pvVar4 = StructVector::GetEntries(vector);
  puVar2 = (pvVar4->
           super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (pvVar4->
                 super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar2; this_00 = this_00 + 1
      ) {
    this = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                     (this_00);
    Vector::SetVectorType(this,CONSTANT_VECTOR);
    vector_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (this_00);
    SetNull(vector_00,true);
  }
  return;
}

Assistant:

void ConstantVector::SetNull(Vector &vector, bool is_null) {
	D_ASSERT(vector.GetVectorType() == VectorType::CONSTANT_VECTOR);
	vector.validity.Set(0, !is_null);
	if (is_null) {
		auto &type = vector.GetType();
		auto internal_type = type.InternalType();
		if (internal_type == PhysicalType::STRUCT) {
			// set all child entries to null as well
			auto &entries = StructVector::GetEntries(vector);
			for (auto &entry : entries) {
				entry->SetVectorType(VectorType::CONSTANT_VECTOR);
				ConstantVector::SetNull(*entry, is_null);
			}
		} else if (internal_type == PhysicalType::ARRAY) {
			auto &child = ArrayVector::GetEntry(vector);
			D_ASSERT(child.GetVectorType() == VectorType::CONSTANT_VECTOR ||
			         child.GetVectorType() == VectorType::FLAT_VECTOR);
			auto array_size = ArrayType::GetSize(type);
			if (child.GetVectorType() == VectorType::CONSTANT_VECTOR) {
				D_ASSERT(array_size == 1);
				ConstantVector::SetNull(child, is_null);
			} else {
				for (idx_t i = 0; i < array_size; i++) {
					FlatVector::SetNull(child, i, is_null);
				}
			}
		}
	}
}